

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  bool bVar1;
  pointer prVar2;
  char *in_R8;
  iterator iVar3;
  string_view separator;
  iterator local_a8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string local_78;
  undefined1 local_58 [8];
  iterator it;
  FileDescriptorTables *local_40;
  undefined1 local_38 [8];
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  SourceCodeInfo *info_local;
  vector<int,_std::allocator<int>_> *path_local;
  FileDescriptorTables *this_local;
  
  local_40 = this;
  p.second = info;
  _local_38 = std::
              make_pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*&>
                        (&local_40,&p.second);
  it.field_1.slot_ = (slot_type *)local_38;
  absl::lts_20250127::
  call_once<void(&)(std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*),std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*>
            (&this->locations_by_path_once_,BuildLocationsByPath,
             (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
              **)&it.field_1.slot_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,",");
  separator._M_str = in_R8;
  separator._M_len = (size_t)local_88._M_str;
  absl::lts_20250127::StrJoin<std::vector<int,std::allocator<int>>>
            (&local_78,(lts_20250127 *)path,(vector<int,_std::allocator<int>_> *)local_88._M_len,
             separator);
  iVar3 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
          ::find<std::__cxx11::string>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
                      *)&this->locations_by_path_,&local_78);
  it.ctrl_ = (ctrl_t *)iVar3.field_1;
  local_58 = (undefined1  [8])iVar3.ctrl_;
  std::__cxx11::string::~string((string *)&local_78);
  local_a8[0] = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                       *)&this->locations_by_path_);
  bVar1 = absl::lts_20250127::container_internal::operator==((iterator *)local_58,local_a8);
  if (bVar1) {
    this_local = (FileDescriptorTables *)0x0;
  }
  else {
    prVar2 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
             ::iterator::operator->((iterator *)local_58);
    this_local = (FileDescriptorTables *)prVar2->second;
  }
  return (SourceCodeInfo_Location *)this_local;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  absl::call_once(locations_by_path_once_,
                  FileDescriptorTables::BuildLocationsByPath, &p);
  auto it = locations_by_path_.find(absl::StrJoin(path, ","));
  if (it == locations_by_path_.end()) return nullptr;
  return it->second;
}